

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O3

void __thiscall
DynamicKReach::resume_bfs
          (DynamicKReach *this,vertex_t s,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uint uVar1;
  pointer puVar2;
  vertex_t *pvVar3;
  pointer puVar4;
  uint *puVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint *nxt;
  uint *puVar10;
  ulong uVar11;
  
  uVar8 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (uVar8 < uVar7) {
    if (puVar2[uVar8] == '?') {
      __assert_fail("dist.at(s) != INF8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/DynamicKReach.cpp"
                    ,0xa2,"void DynamicKReach::resume_bfs(vertex_t, std::vector<distance_t> &)");
    }
    this->back_ = 1;
    pvVar3 = (this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == pvVar3) {
      uVar7 = 0;
      uVar8 = 0;
    }
    else {
      *pvVar3 = s;
      uVar8 = 0;
      while( true ) {
        this->front_ = uVar8 + 1;
        puVar4 = (this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(this->queue_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
        if (uVar7 <= uVar8) break;
        uVar1 = puVar4[uVar8];
        uVar11 = (ulong)uVar1;
        puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
        uVar8 = uVar11;
        if (uVar7 <= uVar11) break;
        if (puVar2[uVar11] < this->k_) {
          pvVar6 = Graph::successors(this->graph_,uVar1);
          puVar5 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          for (puVar10 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar5;
              puVar10 = puVar10 + 1) {
            uVar9 = (ulong)*puVar10;
            puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar7 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
            uVar8 = uVar9;
            if ((uVar7 <= uVar9) || (uVar8 = uVar11, uVar7 <= uVar11)) goto LAB_001068bd;
            if (puVar2[uVar11] + 1 < (uint)puVar2[uVar9]) {
              puVar2[uVar9] = puVar2[uVar11] + 1;
              pvVar6 = Graph::successors(this->graph_,*puVar10);
              if ((pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish !=
                  (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar1 = *puVar10;
                uVar8 = this->back_;
                this->back_ = uVar8 + 1;
                puVar4 = (this->queue_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar7 = (long)(this->queue_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
                if (uVar7 <= uVar8) goto LAB_001068bd;
                puVar4[uVar8] = uVar1;
              }
            }
          }
        }
        uVar8 = this->front_;
        if (this->back_ == uVar8) {
          return;
        }
      }
    }
  }
LAB_001068bd:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8,uVar7
            );
}

Assistant:

void DynamicKReach::resume_bfs(vertex_t s, std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    assert(dist.at(s) != INF8);
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(cur)) {
            if (dist.at(nxt) <= dist.at(cur) + 1) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (graph_.successors(nxt).size() > 0) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}